

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MemberSymbols.cpp
# Opt level: O2

void slang::ast::ModportSymbol::fromSyntax
               (ASTContext *context,ModportDeclarationSyntax *syntax,
               SmallVectorBase<const_slang::ast::ModportSymbol_*> *results)

{
  TokenKind TVar1;
  SyntaxKind SVar2;
  AnsiPortListSyntax *pAVar3;
  long lVar4;
  SyntaxNode *syntax_00;
  span<const_slang::syntax::AttributeInstanceSyntax_*const,_18446744073709551615UL> syntax_01;
  span<const_slang::syntax::AttributeInstanceSyntax_*const,_18446744073709551615UL> syntax_02;
  span<const_slang::syntax::AttributeInstanceSyntax_*const,_18446744073709551615UL> syntax_03;
  span<const_slang::syntax::AttributeInstanceSyntax_*const,_18446744073709551615UL> syntax_04;
  ArgumentDirection direction;
  ModportItemSyntax *pMVar5;
  ModportClockingPortSyntax *syntax_05;
  ModportNamedPortSyntax *syntax_06;
  MethodPrototypeSymbol *this;
  ModportClockingSymbol *this_00;
  char *pcVar6;
  ModportExplicitPortSyntax *syntax_07;
  ModportPortSymbol *this_01;
  SeparatedSyntaxList<slang::syntax::MemberSyntax> *pSVar7;
  ModportSubroutinePortListSyntax *portList;
  ModportSymbol *modport;
  iterator __begin5;
  iterator __begin3;
  const_iterator __begin2;
  ModportSymbol *local_a8;
  ASTContext *local_a0;
  iterator_base<slang::syntax::ModportPortSyntax_*> local_98;
  string_view local_88;
  iterator_base<const_slang::syntax::ModportItemSyntax_*> local_78;
  ulong local_68;
  Compilation *local_60;
  ModportDeclarationSyntax *local_58;
  SmallVectorBase<const_slang::ast::ModportSymbol_*> *local_50;
  ParentList *local_48;
  char *local_40;
  SeparatedSyntaxList<slang::syntax::MemberSyntax> *local_38;
  
  local_60 = ((context->scope).ptr)->compilation;
  local_78.list = &syntax->items;
  local_78.index = 0;
  local_68 = (syntax->items).elements._M_extent._M_extent_value + 1 >> 1;
  local_a0 = context;
  local_58 = syntax;
  local_50 = results;
  local_48 = local_78.list;
  for (; (local_78.list != local_48 || (local_78.index != local_68));
      local_78.index = local_78.index + 1) {
    pMVar5 = slang::syntax::SeparatedSyntaxList<slang::syntax::ModportItemSyntax>::
             iterator_base<const_slang::syntax::ModportItemSyntax_*>::dereference(&local_78);
    local_88 = parsing::Token::valueText(&pMVar5->name);
    local_98.list = (ParentList *)parsing::Token::location(&pMVar5->name);
    local_a8 = BumpAllocator::
               emplace<slang::ast::ModportSymbol,slang::ast::Compilation&,std::basic_string_view<char,std::char_traits<char>>,slang::SourceLocation>
                         (&local_60->super_BumpAllocator,local_60,&local_88,
                          (SourceLocation *)&local_98);
    (local_a8->super_Symbol).originatingSyntax = &pMVar5->super_SyntaxNode;
    syntax_01._M_ptr =
         (local_58->super_MemberSyntax).attributes.
         super_span<slang::syntax::AttributeInstanceSyntax_*,_18446744073709551615UL>._M_ptr;
    syntax_01._M_extent._M_extent_value =
         (local_58->super_MemberSyntax).attributes.
         super_span<slang::syntax::AttributeInstanceSyntax_*,_18446744073709551615UL>._M_extent.
         _M_extent_value;
    Symbol::setAttributes(&local_a8->super_Symbol,(local_a0->scope).ptr,syntax_01);
    SmallVectorBase<slang::ast::ModportSymbol_const*>::
    emplace_back<slang::ast::ModportSymbol_const*const&>
              ((SmallVectorBase<slang::ast::ModportSymbol_const*> *)local_50,&local_a8);
    pAVar3 = (pMVar5->ports).ptr;
    local_38 = &pAVar3->ports;
    local_88._M_str = (char *)0x0;
    local_88._M_len = (size_t)local_38;
    local_40 = (char *)((pAVar3->ports).elements._M_extent._M_extent_value + 1 >> 1);
    pcVar6 = (char *)0x0;
    pSVar7 = local_38;
    while ((pSVar7 != local_38 || (pcVar6 != local_40))) {
      syntax_05 = (ModportClockingPortSyntax *)
                  slang::syntax::SeparatedSyntaxList<slang::syntax::MemberSyntax>::
                  iterator_base<slang::syntax::MemberSyntax_*>::dereference
                            ((iterator_base<slang::syntax::MemberSyntax_*> *)&local_88);
      SVar2 = (syntax_05->super_MemberSyntax).super_SyntaxNode.kind;
      if (SVar2 == ModportClockingPort) {
        this_00 = ModportClockingSymbol::fromSyntax(local_a0,syntax_05);
        syntax_03._M_ptr =
             (syntax_05->super_MemberSyntax).attributes.
             super_span<slang::syntax::AttributeInstanceSyntax_*,_18446744073709551615UL>._M_ptr;
        syntax_03._M_extent._M_extent_value =
             (syntax_05->super_MemberSyntax).attributes.
             super_span<slang::syntax::AttributeInstanceSyntax_*,_18446744073709551615UL>._M_extent.
             _M_extent_value;
        Symbol::setAttributes(&this_00->super_Symbol,&local_a8->super_Scope,syntax_03);
        Scope::addMember(&local_a8->super_Scope,&this_00->super_Symbol);
      }
      else if (SVar2 == ModportSubroutinePortList) {
        TVar1 = (syntax_05->clocking).kind;
        if (TVar1 == ExportKeyword) {
          local_a8->hasExports = true;
        }
        local_98.index = 0;
        lVar4 = *(long *)&syntax_05[1].super_MemberSyntax.attributes.super_SyntaxListBase.
                          super_SyntaxNode;
        local_98.list = (ParentList *)&syntax_05->name;
        for (; (local_98.list != (ParentList *)&syntax_05->name ||
               (local_98.index != lVar4 + 1U >> 1)); local_98.index = local_98.index + 1) {
          syntax_06 = (ModportNamedPortSyntax *)
                      slang::syntax::SeparatedSyntaxList<slang::syntax::ModportPortSyntax>::
                      iterator_base<slang::syntax::ModportPortSyntax_*>::dereference(&local_98);
          syntax_00 = (syntax_06->super_ModportPortSyntax).super_SyntaxNode.previewNode;
          if (syntax_00 != (SyntaxNode *)0x0) {
            Scope::addMembers(&local_a8->super_Scope,syntax_00);
          }
          if ((syntax_06->super_ModportPortSyntax).super_SyntaxNode.kind == ModportNamedPort) {
            this = MethodPrototypeSymbol::fromSyntax(local_a0,syntax_06,TVar1 == ExportKeyword);
          }
          else {
            this = MethodPrototypeSymbol::fromSyntax
                             ((local_a0->scope).ptr,(ModportSubroutinePortSyntax *)syntax_06,
                              TVar1 == ExportKeyword);
          }
          syntax_02._M_ptr =
               (syntax_05->super_MemberSyntax).attributes.
               super_span<slang::syntax::AttributeInstanceSyntax_*,_18446744073709551615UL>._M_ptr;
          syntax_02._M_extent._M_extent_value =
               (syntax_05->super_MemberSyntax).attributes.
               super_span<slang::syntax::AttributeInstanceSyntax_*,_18446744073709551615UL>.
               _M_extent._M_extent_value;
          Symbol::setAttributes(&this->super_Symbol,&local_a8->super_Scope,syntax_02);
          Scope::addMember(&local_a8->super_Scope,&this->super_Symbol);
        }
      }
      else {
        direction = SemanticFacts::getDirection((syntax_05->clocking).kind);
        local_98.index = 0;
        lVar4 = *(long *)&syntax_05[1].super_MemberSyntax.attributes.super_SyntaxListBase.
                          super_SyntaxNode;
        local_98.list = (ParentList *)&syntax_05->name;
        for (; (local_98.list != (ParentList *)&syntax_05->name ||
               (local_98.index != lVar4 + 1U >> 1)); local_98.index = local_98.index + 1) {
          syntax_07 = (ModportExplicitPortSyntax *)
                      slang::syntax::SeparatedSyntaxList<slang::syntax::ModportPortSyntax>::
                      iterator_base<slang::syntax::ModportPortSyntax_*>::dereference(&local_98);
          if ((syntax_07->super_ModportPortSyntax).super_SyntaxNode.kind == ModportNamedPort) {
            this_01 = ModportPortSymbol::fromSyntax
                                (local_a0,direction,(ModportNamedPortSyntax *)syntax_07);
          }
          else {
            this_01 = ModportPortSymbol::fromSyntax(local_a0,direction,syntax_07);
          }
          syntax_04._M_ptr =
               (syntax_05->super_MemberSyntax).attributes.
               super_span<slang::syntax::AttributeInstanceSyntax_*,_18446744073709551615UL>._M_ptr;
          syntax_04._M_extent._M_extent_value =
               (syntax_05->super_MemberSyntax).attributes.
               super_span<slang::syntax::AttributeInstanceSyntax_*,_18446744073709551615UL>.
               _M_extent._M_extent_value;
          Symbol::setAttributes((Symbol *)this_01,&local_a8->super_Scope,syntax_04);
          Scope::addMember(&local_a8->super_Scope,(Symbol *)this_01);
        }
      }
      pcVar6 = local_88._M_str + 1;
      local_88._M_str = pcVar6;
      pSVar7 = (SeparatedSyntaxList<slang::syntax::MemberSyntax> *)local_88._M_len;
    }
  }
  return;
}

Assistant:

void ModportSymbol::fromSyntax(const ASTContext& context, const ModportDeclarationSyntax& syntax,
                               SmallVectorBase<const ModportSymbol*>& results) {
    auto& comp = context.getCompilation();
    for (auto item : syntax.items) {
        auto modport = comp.emplace<ModportSymbol>(comp, item->name.valueText(),
                                                   item->name.location());
        modport->setSyntax(*item);
        modport->setAttributes(*context.scope, syntax.attributes);
        results.push_back(modport);

        for (auto port : item->ports->ports) {
            switch (port->kind) {
                case SyntaxKind::ModportSimplePortList: {
                    auto& portList = port->as<ModportSimplePortListSyntax>();
                    auto direction = SemanticFacts::getDirection(portList.direction.kind);
                    for (auto simplePort : portList.ports) {
                        switch (simplePort->kind) {
                            case SyntaxKind::ModportNamedPort: {
                                auto& mpp = ModportPortSymbol::fromSyntax(
                                    context, direction, simplePort->as<ModportNamedPortSyntax>());
                                mpp.setAttributes(*modport, portList.attributes);
                                modport->addMember(mpp);
                                break;
                            }
                            case SyntaxKind::ModportExplicitPort: {
                                auto& mpp = ModportPortSymbol::fromSyntax(
                                    context, direction,
                                    simplePort->as<ModportExplicitPortSyntax>());
                                mpp.setAttributes(*modport, portList.attributes);
                                modport->addMember(mpp);
                                break;
                            }
                            default:
                                SLANG_UNREACHABLE;
                        }
                    }
                    break;
                }
                case SyntaxKind::ModportSubroutinePortList: {
                    auto& portList = port->as<ModportSubroutinePortListSyntax>();
                    bool isExport = portList.importExport.kind == TokenKind::ExportKeyword;
                    if (isExport)
                        modport->hasExports = true;

                    for (auto subPort : portList.ports) {
                        if (subPort->previewNode)
                            modport->addMembers(*subPort->previewNode);

                        switch (subPort->kind) {
                            case SyntaxKind::ModportNamedPort: {
                                auto& mps = MethodPrototypeSymbol::fromSyntax(
                                    context, subPort->as<ModportNamedPortSyntax>(), isExport);
                                mps.setAttributes(*modport, portList.attributes);
                                modport->addMember(mps);
                                break;
                            }
                            case SyntaxKind::ModportSubroutinePort: {
                                auto& mps = MethodPrototypeSymbol::fromSyntax(
                                    *context.scope, subPort->as<ModportSubroutinePortSyntax>(),
                                    isExport);
                                mps.setAttributes(*modport, portList.attributes);
                                modport->addMember(mps);
                                break;
                            }
                            default:
                                SLANG_UNREACHABLE;
                        }
                    }
                    break;
                }
                case SyntaxKind::ModportClockingPort: {
                    auto& clockingPort = port->as<ModportClockingPortSyntax>();
                    auto& mcs = ModportClockingSymbol::fromSyntax(context, clockingPort);
                    mcs.setAttributes(*modport, clockingPort.attributes);
                    modport->addMember(mcs);
                    break;
                }
                default: {
                    SLANG_UNREACHABLE;
                }
            }
        }
    }
}